

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall
SAT::explainUnlearnable(SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *param_1)

{
  char *pcVar1;
  uint i;
  Clause *this_00;
  Lit *pLVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint j;
  uint i_00;
  Lit q;
  int local_50;
  Lit p;
  vec<Lit> local_48;
  long local_38;
  
  local_38 = std::chrono::_V2::steady_clock::now();
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (Lit *)0x0;
  uVar5 = 1;
  while (uVar5 < (this->out_learnt).sz) {
    p.x = (this->out_learnt).data[uVar5].x;
    if (((uint)(this->flags).data[(uint)(p.x >> 1)] & 4) == 0) {
      this_00 = getExpl(this,(Lit)(p.x ^ 1));
      vec<Lit>::push(&local_48,&p);
      pLVar2 = (this->out_learnt).data;
      pLVar2[uVar5].x = pLVar2[(this->out_learnt).sz - 1].x;
      (this->out_learnt).sz = (this->out_learnt).sz - 1;
      (this->out_learnt_level).sz = (this->out_learnt_level).sz - 1;
      for (i_00 = 1; i_00 < *(uint *)this_00 >> 8; i_00 = i_00 + 1) {
        pLVar2 = Clause::operator[](this_00,i_00);
        q.x = pLVar2->x;
        pcVar1 = (this->seen).data;
        if (pcVar1[(uint)(q.x >> 1)] == '\0') {
          pcVar1[(uint)(q.x >> 1)] = '\x01';
          vec<Lit>::push(&this->out_learnt,&q);
          local_50 = getLevel(this,q.x >> 1);
          vec<int>::push(&this->out_learnt_level,&local_50);
        }
      }
    }
    else {
      uVar5 = uVar5 + 1;
    }
  }
  for (uVar3 = 0; uVar3 < (local_48._0_8_ & 0xffffffff); uVar3 = uVar3 + 1) {
    (this->seen).data[(uint)(local_48.data[uVar3].x >> 1)] = '\0';
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  (this->pushback_time).__r = (this->pushback_time).__r + (lVar4 - local_38) / 1000000;
  free(local_48.data);
  return;
}

Assistant:

void SAT::explainUnlearnable(std::set<int>& /*contributingNogoods*/) {
	const time_point start = chuffed_clock::now();

	vec<Lit> removed;
	for (unsigned int i = 1; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		if (flags[var(p)].learnable()) {
			continue;
		}
		assert(!reason[var(p)].isLazy());
		Clause& c = *getExpl(~p);
		removed.push(p);
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			}
		}
	}

	for (unsigned int i = 0; i < removed.size(); i++) {
		seen[var(removed[i])] = 0;
	}

	pushback_time += std::chrono::duration_cast<duration>(chuffed_clock::now() - start);
}